

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::insert
          (IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *this,unsigned_long left,
          unsigned_long right,ValueDriver **value,allocator_type *alloc)

{
  char *pcVar1;
  uint size;
  uint32_t uVar2;
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *pIVar3;
  ulong uVar4;
  iterator it;
  const_iterator local_70;
  
  if (this->height == 0) {
    size = this->rootSize;
    if ((ulong)size != 8) {
      if (size != 0) {
        uVar4 = 0;
        pIVar3 = this;
        do {
          if (left <= (pIVar3->field_0).rootLeaf.
                      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                      .first[0].left) goto LAB_0028e740;
          uVar4 = uVar4 + 1;
          pIVar3 = (IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *)
                   ((pIVar3->field_0).rootLeaf.
                    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                    .first + 1);
        } while (size != uVar4);
      }
      uVar4 = (ulong)size;
LAB_0028e740:
      local_70.map = (IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *)left;
      local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ =
           (pointer)right;
      uVar2 = IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>
              ::insertFrom((LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true> *)
                           this,(uint32_t)uVar4,size,(interval<unsigned_long> *)&local_70,value);
      this->rootSize = uVar2;
      return;
    }
  }
  pcVar1 = local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
           firstElement;
  local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = 0;
  local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.cap = 2;
  local_70.map = this;
  local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ =
       (pointer)pcVar1;
  const_iterator::setToFind(&local_70,left,right);
  iterator::insert((iterator *)&local_70,left,right,value,alloc);
  if (local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)pcVar1) {
    operator_delete(local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                    .data_);
  }
  return;
}

Assistant:

void insert(TKey left, TKey right, const TValue& value, allocator_type& alloc) {
        if (isFlat() && rootSize != RootLeaf::Capacity) {
            uint32_t i = rootLeaf.find(rootSize, {left, right});
            rootSize = rootLeaf.insertFrom(i, rootSize, {left, right}, value);
        }
        else {
            iterator it(*this);
            it.setToFind(left, right);
            it.insert(left, right, value, alloc);
        }
    }